

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<std::__cxx11::string,char[22]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [22])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_t local_48;
  char *pcStack_40;
  size_type local_38;
  pointer local_30;
  size_t local_28;
  char (*local_20) [22];
  
  local_58._M_len = (a->View_)._M_len;
  local_58._M_str = (a->View_)._M_str;
  local_48 = (b->View_)._M_len;
  pcStack_40 = (b->View_)._M_str;
  local_30 = (args->_M_dataplus)._M_p;
  local_38 = args->_M_string_length;
  local_28 = strlen(*args_1);
  views._M_len = 4;
  views._M_array = &local_58;
  local_20 = args_1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}